

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

Real __thiscall
amrex::MLMG::solve(MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
                  Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs,Real a_tol_rel,
                  Real a_tol_abs,char *checkpoint_file)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  MLLinOp *pMVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pAVar6;
  iterator __position;
  bool bVar7;
  BottomSolver BVar8;
  int iVar9;
  MultiFab *pMVar10;
  MultiFab **ppMVar11;
  ulong uVar12;
  pointer pAVar13;
  long lVar14;
  long lVar15;
  int iter;
  bool bVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  double dVar18;
  initializer_list<std::reference_wrapper<double>_> __l;
  Real fine_norminf;
  string norm_name;
  Real resnorm0;
  Real rhsnorm0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> mf_sol;
  double local_248;
  uint local_240;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_238;
  vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_230;
  Real local_210;
  MultiFab *local_208;
  MultiFab *local_200;
  Real local_1f8;
  double local_1f0;
  double local_1e8;
  vector<double,std::allocator<double>> *local_1e0;
  double local_1d8;
  undefined1 local_1d0 [24];
  undefined8 auStack_1b8 [46];
  vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_> local_48;
  
  local_238 = a_sol;
  local_210 = a_tol_abs;
  if (checkpoint_file != (char *)0x0) {
    bVar7 = Any::is<amrex::MultiFab>
                      ((a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (bVar7) {
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1d0,
                 (long)this->namrlevs,(allocator_type *)&local_230);
      std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                (&local_230,(long)this->namrlevs,(allocator_type *)&local_248);
      if (0 < this->namrlevs) {
        lVar15 = 0;
        lVar14 = 0;
        do {
          pMVar10 = Any::get<amrex::MultiFab>
                              ((Any *)((long)&(((local_238->
                                                super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                                ).
                                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr).
                                              _M_t.
                                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                              .
                                              super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                              ._M_head_impl + lVar15));
          *(MultiFab **)(local_1d0._0_8_ + lVar15) = pMVar10;
          pMVar10 = Any::get<amrex::MultiFab>
                              ((Any *)((long)&(((a_rhs->
                                                super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                                ).
                                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr).
                                              _M_t.
                                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                              .
                                              super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                              ._M_head_impl + lVar15));
          *(MultiFab **)
           ((long)local_230.
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15) = pMVar10;
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 8;
        } while (lVar14 < this->namrlevs);
      }
      checkPoint(this,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1d0,
                 (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &local_230,a_tol_rel,local_210,checkpoint_file);
      if (local_230.
          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.
                        super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(local_230.
                                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_230.
                                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)local_230.
                              super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((MultiFab **)local_1d0._0_8_ != (MultiFab **)0x0) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ - local_1d0._0_8_);
      }
    }
    else {
      Abort_host("MLMG::solve: checkpoint not supported for non-MultiFab type");
    }
  }
  if (this->bottom_solver == Default) {
    BVar8 = (*this->linop->_vptr_MLLinOp[4])();
    this->bottom_solver = BVar8;
  }
  pMVar3 = this->linop->m_parent;
  local_1e8 = second();
  piVar4 = (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar4) {
    (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar4
    ;
  }
  pdVar5 = (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar5) {
    (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar5;
  }
  prepareForSolve(this,local_238,a_rhs);
  computeMLResidual(this,this->finest_amr_lev);
  local_208 = (MultiFab *)MLResNormInf(this,this->finest_amr_lev,false);
  local_200 = (MultiFab *)MLRhsNormInf(this,false);
  if (pMVar3 == (MLLinOp *)0x0) {
    local_1d0._0_8_ = &local_208;
    local_1d0._8_8_ = &local_200;
    __l._M_len = 2;
    __l._M_array = (iterator)local_1d0;
    std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
    vector(&local_48,__l,(allocator_type *)&local_230);
    if (local_48.
        super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (0 < this->verbose) {
      local_1d0._8_8_ = OutStream();
      poVar1 = (ostringstream *)(local_1d0 + 0x10);
      local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"MLMG: Initial rhs               = ",0x22);
      std::ostream::_M_insert<double>((double)local_200);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"MLMG: Initial residual (resid0) = ",0x22);
      std::ostream::_M_insert<double>((double)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      Print::~Print((Print *)local_1d0);
    }
  }
  this->m_init_resnorm0 = (Real)local_208;
  this->m_rhsnorm0 = (Real)local_200;
  local_230.super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_230.
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_230.super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  if ((this->always_use_bnorm != 0) || ((double)local_208 <= (double)local_200)) {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,0x67dc5e);
    ppMVar11 = &local_200;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,0x67dc64);
    ppMVar11 = &local_208;
  }
  pMVar10 = *ppMVar11;
  dVar17 = 1e-16;
  if (1e-16 <= a_tol_rel) {
    dVar17 = a_tol_rel;
  }
  dVar18 = dVar17 * (double)pMVar10;
  if (dVar17 * (double)pMVar10 <= local_210) {
    dVar18 = local_210;
  }
  if ((pMVar3 != (MLLinOp *)0x0) || (dVar18 < (double)local_208)) {
    local_210 = dVar18;
    local_1f0 = second();
    iVar9 = this->do_fixed_number_of_iters;
    if (iVar9 == 0) {
      iVar9 = this->max_iters;
    }
    if (0 < iVar9) {
      local_1e0 = (vector<double,std::allocator<double>> *)&this->m_iter_fine_resnorm0;
      poVar1 = (ostringstream *)(local_1d0 + 0x10);
      local_1d8 = (double)pMVar10 * 1e+20;
      iter = 0;
      do {
        oneIter(this,iter);
        lVar14 = (long)this->finest_amr_lev;
        pAVar6 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar13 = pAVar6 + lVar14 + -1;
        if (lVar14 < 1) {
          pAVar13 = (pointer)0x0;
        }
        (*this->linop->_vptr_MLLinOp[0x34])
                  (this->linop,lVar14,
                   *(undefined8 *)
                    &(this->res).
                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14].
                     super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,pAVar6 + lVar14,
                   (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14,pAVar13);
        if (pMVar3 == (MLLinOp *)0x0) {
          (*this->linop->_vptr_MLLinOp[0x33])
                    (this->linop,(long)this->finest_amr_lev,
                     *(undefined8 *)
                      &(this->res).
                       super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->finest_amr_lev].
                       super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,0);
          __position._M_current =
               (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          local_248 = extraout_XMM0_Qa;
          if (__position._M_current ==
              (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_1e0,__position,&local_248);
          }
          else {
            *__position._M_current = extraout_XMM0_Qa;
            (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          this->m_final_resnorm0 = local_248;
          if (1 < this->verbose) {
            local_1d0._8_8_ = OutStream();
            local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
            local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"MLMG: Iteration ",0x10);
            *(undefined8 *)
             ((long)&((*(pointer)(local_1d0._16_8_ + -0x18))->super_FabArray<amrex::FArrayBox>).
                     super_FabArrayBase._vptr_FabArrayBase + (long)(auStack_1b8 + 1)) = 3;
            std::ostream::operator<<(poVar1,iter + 1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Fine resid/",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       (char *)local_230.
                               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_230.
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            std::ostream::_M_insert<double>(local_248 / (double)pMVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
            Print::~Print((Print *)local_1d0);
          }
          bVar7 = local_210 < local_248;
          bVar16 = this->namrlevs != 1;
          if ((bVar16 || bVar7) && !bVar7) {
            computeMLResidual(this,this->finest_amr_lev + -1);
            local_1f8 = MLResNormInf(this,this->finest_amr_lev + -1,false);
            if (1 < this->verbose) {
              local_1d0._8_8_ = OutStream();
              poVar2 = (ostringstream *)(local_1d0 + 0x10);
              local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
              local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
                   *(undefined8 *)
                    (local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"MLMG: Iteration ",0x10);
              *(undefined8 *)
               ((long)&((*(pointer)(local_1d0._16_8_ + -0x18))->super_FabArray<amrex::FArrayBox>).
                       super_FabArrayBase._vptr_FabArrayBase + (long)(auStack_1b8 + 1)) = 3;
              std::ostream::operator<<(poVar2,iter + 1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2," Crse resid/",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,
                         (char *)local_230.
                                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_230.
                               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
              std::ostream::_M_insert<double>(local_1f8 / (double)pMVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
              Print::~Print((Print *)local_1d0);
            }
            dVar17 = local_1f8;
            if (local_1f8 <= local_248) {
              dVar17 = local_248;
            }
            this->m_final_resnorm0 = dVar17;
            if (local_210 < local_1f8) goto LAB_005347e2;
          }
          else if (bVar16 || bVar7) {
LAB_005347e2:
            if (local_1d8 < this->m_final_resnorm0) {
              if (0 < this->verbose) {
                local_1d0._8_8_ = OutStream();
                poVar2 = (ostringstream *)(local_1d0 + 0x10);
                local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
                local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
                std::__cxx11::ostringstream::ostringstream(poVar2);
                *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
                     *(undefined8 *)
                      (local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"MLMG: Failing to converge after ",0x20);
                std::ostream::operator<<(poVar2,iter + 1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2," iterations.",0xc);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2," resid, resid/",0xe);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,
                           (char *)local_230.
                                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (long)local_230.
                                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
                std::ostream::_M_insert<double>(this->m_final_resnorm0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
                std::ostream::_M_insert<double>(this->m_final_resnorm0 / (double)pMVar10);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
                Print::~Print((Print *)local_1d0);
              }
              Abort_host("MLMG failing so lets stop here");
            }
            goto LAB_0053493b;
          }
          if (0 < this->verbose) {
            local_1d0._8_8_ = OutStream();
            poVar1 = (ostringstream *)(local_1d0 + 0x10);
            local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
            local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"MLMG: Final Iter. ",0x12);
            std::ostream::operator<<(poVar1,iter + 1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," resid, resid/",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       (char *)local_230.
                               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_230.
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            std::ostream::_M_insert<double>(this->m_final_resnorm0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>(this->m_final_resnorm0 / (double)pMVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
            Print::~Print((Print *)local_1d0);
          }
          goto LAB_00534c3b;
        }
LAB_0053493b:
        iter = iter + 1;
      } while (iVar9 != iter);
    }
    if (this->do_fixed_number_of_iters == 0) {
      if (0 < this->verbose) {
        local_1d0._8_8_ = OutStream();
        poVar1 = (ostringstream *)(local_1d0 + 0x10);
        local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
             *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"MLMG: Failed to converge after ",0x1f);
        std::ostream::operator<<(poVar1,this->max_iters);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," iterations.",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," resid, resid/",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   (char *)local_230.
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                   (long)local_230.
                         super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        std::ostream::_M_insert<double>(this->m_final_resnorm0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>(this->m_final_resnorm0 / (double)pMVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        Print::~Print((Print *)local_1d0);
      }
      Abort_host("MLMG failed");
    }
LAB_00534c3b:
    dVar17 = second();
    (this->timer).super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
         = dVar17 - local_1f0;
  }
  else {
    this->m_final_resnorm0 = (Real)local_208;
    if (0 < this->verbose) {
      local_1d0._8_8_ = OutStream();
      local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_1d0._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 0x10));
      *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d0 + 0x10),"MLMG: No iterations needed\n",0x1b);
      Print::~Print((Print *)local_1d0);
    }
  }
  bVar7 = this->final_fill_bc != 0;
  local_240 = (uint)bVar7;
  local_248 = (double)(ulong)CONCAT14(bVar7,local_240);
  uVar12 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar12 < 3) {
    *(undefined4 *)((long)&local_248 + uVar12 * 4) = 0;
  }
  iVar9 = this->namrlevs;
  if (0 < iVar9) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      if ((this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar14] == 0) {
        (*this->linop->_vptr_MLLinOp[0x2c])
                  (this->linop,
                   (long)&(((local_238->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                            super__Vector_impl_data._M_start)->m_ptr)._M_t.
                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                   lVar15,(long)&(((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                   .super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                 super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                 .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                 _M_head_impl + lVar15,&local_248);
        iVar9 = this->namrlevs;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar14 < iVar9);
  }
  dVar17 = second();
  *(this->timer).super_vector<double,_std::allocator<double>_>.
   super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar17 - local_1e8;
  if ((0 < this->verbose) && (*(int *)(DAT_0071a620 + -0x3c) == 0)) {
    local_1d0._8_8_ = OutStream();
    poVar1 = (ostringstream *)(local_1d0 + 0x10);
    local_1d0._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_1d0._0_4_ = 0xffffffff;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1b8 + (long)*(pointer)(local_1d0._16_8_ + -0x18)) =
         *(undefined8 *)(local_1d0._8_8_ + *(long *)(*(long *)local_1d0._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"MLMG: Timers: Solve = ",0x16);
    std::ostream::_M_insert<double>
              (*(this->timer).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Iter = ",8);
    std::ostream::_M_insert<double>
              ((this->timer).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Bottom = ",10);
    std::ostream::_M_insert<double>
              ((this->timer).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    Print::~Print((Print *)local_1d0);
  }
  this->solve_called = this->solve_called + 1;
  local_238 = (Vector<amrex::Any,_std::allocator<amrex::Any>_> *)this->m_final_resnorm0;
  if (local_230.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&local_230.
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_230.
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_230.
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_230.
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  return (Real)local_238;
}

Assistant:

Real
MLMG::solve (Vector<Any>& a_sol, const Vector<Any>& a_rhs,
             Real a_tol_rel, Real a_tol_abs, const char* checkpoint_file)
{
    BL_PROFILE("MLMG::solve()");

    if (checkpoint_file != nullptr) {
        if (a_sol[0].is<MultiFab>()) {
            Vector<MultiFab*> mf_sol(namrlevs);
            Vector<MultiFab const*> mf_rhs(namrlevs);
            for (int lev = 0; lev < namrlevs; ++lev) {
                mf_sol[lev] = &(a_sol[lev].get<MultiFab>());
                mf_rhs[lev] = &(a_rhs[lev].get<MultiFab>());
            }
            checkPoint(mf_sol, mf_rhs, a_tol_rel, a_tol_abs, checkpoint_file);
        } else {
            amrex::Abort("MLMG::solve: checkpoint not supported for non-MultiFab type");
        }
    }

    if (bottom_solver == BottomSolver::Default) {
        bottom_solver = linop.getDefaultBottomSolver();
    }

#if defined(AMREX_USE_HYPRE) || defined(AMREX_USE_PETSC)
    if (bottom_solver == BottomSolver::hypre || bottom_solver == BottomSolver::petsc) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(a_sol[0].is<MultiFab>(),
                                         "Non-MultiFab type not supported for hypre and petsc");
        int mo = linop.getMaxOrder();
        if (a_sol[0].get<MultiFab>().hasEBFabFactory()) {
            linop.setMaxOrder(2);
        } else {
            linop.setMaxOrder(std::min(3,mo));  // maxorder = 4 not supported
        }
    }
#endif

    bool is_nsolve = linop.m_parent;

    auto solve_start_time = amrex::second();

    Real& composite_norminf = m_final_resnorm0;

    m_niters_cg.clear();
    m_iter_fine_resnorm0.clear();

    prepareForSolve(a_sol, a_rhs);

    computeMLResidual(finest_amr_lev);

    bool local = true;
    Real resnorm0 = MLResNormInf(finest_amr_lev, local);
    Real rhsnorm0 = MLRhsNormInf(local);
    if (!is_nsolve) {
        ParallelAllReduce::Max<Real>({resnorm0, rhsnorm0}, ParallelContext::CommunicatorSub());

        if (verbose >= 1)
        {
            amrex::Print() << "MLMG: Initial rhs               = " << rhsnorm0 << "\n"
                           << "MLMG: Initial residual (resid0) = " << resnorm0 << "\n";
        }
    }

    m_init_resnorm0 = resnorm0;
    m_rhsnorm0 = rhsnorm0;

    Real max_norm;
    std::string norm_name;
    if (always_use_bnorm || rhsnorm0 >= resnorm0) {
        norm_name = "bnorm";
        max_norm = rhsnorm0;
    } else {
        norm_name = "resid0";
        max_norm = resnorm0;
    }
    const Real res_target = std::max(a_tol_abs, std::max(a_tol_rel,Real(1.e-16))*max_norm);

    if (!is_nsolve && resnorm0 <= res_target) {
        composite_norminf = resnorm0;
        if (verbose >= 1) {
            amrex::Print() << "MLMG: No iterations needed\n";
        }
    } else {
        auto iter_start_time = amrex::second();
        bool converged = false;

        const int niters = do_fixed_number_of_iters ? do_fixed_number_of_iters : max_iters;
        for (int iter = 0; iter < niters; ++iter)
        {
            oneIter(iter);

            converged = false;

            // Test convergence on the fine amr level
            computeResidual(finest_amr_lev);

            if (is_nsolve) continue;

            Real fine_norminf = ResNormInf(finest_amr_lev);
            m_iter_fine_resnorm0.push_back(fine_norminf);
            composite_norminf = fine_norminf;
            if (verbose >= 2) {
                amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1 << " Fine resid/"
                               << norm_name << " = " << fine_norminf/max_norm << "\n";
            }
            bool fine_converged = (fine_norminf <= res_target);

            if (namrlevs == 1 && fine_converged) {
                converged = true;
            } else if (fine_converged) {
                // finest level is converged, but we still need to test the coarse levels
                computeMLResidual(finest_amr_lev-1);
                Real crse_norminf = MLResNormInf(finest_amr_lev-1);
                if (verbose >= 2) {
                    amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1
                                   << " Crse resid/" << norm_name << " = "
                                   << crse_norminf/max_norm << "\n";
                }
                converged = (crse_norminf <= res_target);
                composite_norminf = std::max(fine_norminf, crse_norminf);
            } else {
                converged = false;
            }

            if (converged) {
                if (verbose >= 1) {
                    amrex::Print() << "MLMG: Final Iter. " << iter+1
                                   << " resid, resid/" << norm_name << " = "
                                   << composite_norminf << ", "
                                   << composite_norminf/max_norm << "\n";
                }
                break;
            } else {
              if (composite_norminf > Real(1.e20)*max_norm)
              {
                  if (verbose > 0) {
                      amrex::Print() << "MLMG: Failing to converge after " << iter+1 << " iterations."
                                     << " resid, resid/" << norm_name << " = "
                                     << composite_norminf << ", "
                                     << composite_norminf/max_norm << "\n";
                  }
                  amrex::Abort("MLMG failing so lets stop here");
              }
            }
        }

        if (!converged && do_fixed_number_of_iters == 0) {
            if (verbose > 0) {
                amrex::Print() << "MLMG: Failed to converge after " << max_iters << " iterations."
                               << " resid, resid/" << norm_name << " = "
                               << composite_norminf << ", "
                               << composite_norminf/max_norm << "\n";
            }
            amrex::Abort("MLMG failed");
        }
        timer[iter_time] = amrex::second() - iter_start_time;
    }

    IntVect ng_back = final_fill_bc ? IntVect(1) : IntVect(0);
    if (linop.hasHiddenDimension()) {
        ng_back[linop.hiddenDirection()] = 0;
    }
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (!sol_is_alias[alev]) {
            linop.AnyCopy(a_sol[alev], sol[alev], ng_back);
        }
    }

    timer[solve_time] = amrex::second() - solve_start_time;
    if (verbose >= 1) {
        ParallelReduce::Max<double>(timer.data(), timer.size(), 0,
                                    ParallelContext::CommunicatorSub());
        if (ParallelContext::MyProcSub() == 0)
        {
            amrex::AllPrint() << "MLMG: Timers: Solve = " << timer[solve_time]
                              << " Iter = " << timer[iter_time]
                              << " Bottom = " << timer[bottom_time] << "\n";
        }
    }

    ++solve_called;

    return composite_norminf;
}